

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O1

char * parse_identifier(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer;
  gtoken_s token_00;
  gtoken_s token_01;
  gtoken_t token_02;
  char *__dest;
  char *pcVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  uint32_t len;
  gtoken_s token;
  uint32_t local_74;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  char *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  char *local_28;
  
  lexer = parser->lexer->p[parser->lexer->n - 1];
  token_02 = gravity_lexer_peek(lexer);
  if (token_02 == TOK_IDENTIFIER) {
    gravity_lexer_next(lexer);
    gravity_lexer_token(lexer);
    local_74 = 0;
    token_00.colno = (int)uStack_68;
    token_00.type = (undefined4)local_70;
    token_00.lineno = local_70._4_4_;
    token_00.position = (int)((ulong)uStack_68 >> 0x20);
    token_00.bytes = (int)local_60;
    token_00.length = (int)((ulong)local_60 >> 0x20);
    token_00.fileid = (int)uStack_58;
    token_00.builtin = (int)((ulong)uStack_58 >> 0x20);
    token_00.value = local_50;
    pcVar1 = token_string(token_00,&local_74);
    __dest = (char *)gravity_calloc((gravity_vm *)0x0,1,(ulong)(local_74 + 1));
    memcpy(__dest,pcVar1,(ulong)local_74);
  }
  else if (token_02 == TOK_ERROR) {
    parse_error(parser);
    __dest = (char *)0x0;
  }
  else {
    gravity_lexer_token(lexer);
    pcVar1 = token_name(token_02);
    __dest = (char *)0x0;
    token_01.lineno = uStack_44;
    token_01.type = local_48;
    token_01.colno = uStack_40;
    token_01.position = uStack_3c;
    token_01.bytes = local_38;
    token_01.length = uStack_34;
    token_01.fileid = uStack_30;
    token_01.builtin = uStack_2c;
    token_01.value = local_28;
    report_error(parser,GRAVITY_ERROR_SYNTAX,token_01,"Expected identifier but found %s",pcVar1,
                 in_R8,in_R9);
  }
  return __dest;
}

Assistant:

static const char *parse_identifier (gravity_parser_t *parser) {
    DECLARE_LEXER;

    // parse IDENTIFIER is always mandatory
    gtoken_t type = gravity_lexer_peek(lexer);
    if (type != TOK_IDENTIFIER) {
        if (type == TOK_ERROR) parse_error(parser);
        else REPORT_ERROR(gravity_lexer_token(lexer), "Expected identifier but found %s", token_name(type));
        return NULL;
    }

    gravity_lexer_next(lexer);
    gtoken_s token = gravity_lexer_token(lexer);
    const char *identifier = cstring_from_token(parser, token);
    return identifier;
}